

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  int *piVar9;
  Layer *pLVar10;
  void *pvVar11;
  undefined4 *puVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  sbyte sVar19;
  undefined4 uVar20;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  int iVar28;
  byte bVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  uint _w;
  int iVar41;
  long lVar42;
  long lVar43;
  byte bVar44;
  undefined7 uVar46;
  uint _elempack;
  ulong uVar47;
  Option *_elemsize;
  void *pvVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar58;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  v4sf one;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  int local_248;
  ulong local_220;
  Mat local_208;
  Option *local_1c0;
  Mat local_1b8;
  Mat local_168;
  void *local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  int local_100;
  Allocator *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  int local_e0;
  ulong local_d8;
  pointer local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  int local_90;
  ulong local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uVar22;
  undefined3 uVar24;
  undefined2 uVar26;
  Option *pOVar45;
  
  if ((opt->use_int8_inference == true) && ((this->super_ConvolutionDepthWise).int8_scale_term != 0)
     ) {
    iVar30 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar30;
  }
  uVar33 = bottom_blob->c;
  uVar47 = bottom_blob->elemsize;
  iVar30 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar37 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar34 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar32 = (this->super_ConvolutionDepthWise).dilation_h;
  iVar36 = bottom_blob->elempack;
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize._0_4_ = 0;
  local_1b8.elemsize._4_4_ = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,bottom_blob,&local_1b8,opt);
  iVar28 = local_1b8.w;
  iVar39 = -100;
  if ((local_1b8.data == (void *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0))
  goto LAB_0040bd2d;
  uVar13 = (long)(~((iVar30 + -1) * iVar37) + local_1b8.w) /
           (long)(this->super_ConvolutionDepthWise).stride_w;
  local_1c0 = (Option *)(uVar13 & 0xffffffff);
  iVar30 = (~((iVar34 + -1) * iVar32) + local_1b8.h) / (this->super_ConvolutionDepthWise).stride_h;
  _w = (int)uVar13 + 1;
  uVar40 = (this->super_ConvolutionDepthWise).num_output;
  bVar29 = (uVar40 & 3) == 0 & opt->use_packing_layout;
  _elempack = (uint)bVar29 * 3 + 1;
  sVar19 = bVar29 * '\x02';
  _elemsize = (Option *)(uVar47 / (ulong)(long)iVar36 << sVar19);
  pOVar45 = _elemsize;
  Mat::create(top_blob,_w,iVar30 + 1,(int)uVar40 / (int)_elempack,(size_t)_elemsize,_elempack,
              opt->blob_allocator);
  iVar39 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0040bd2d;
  uVar31 = uVar33 * iVar36;
  uVar40 = (this->super_ConvolutionDepthWise).num_output;
  uVar8 = (this->super_ConvolutionDepthWise).group;
  if (uVar8 == uVar40 && (uVar31 ^ uVar8) == 0) {
    if (iVar36 == 1) {
      auVar50._0_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_w == 3);
      auVar50._4_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_h == 3);
      auVar50._8_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_w == 1);
      auVar50._12_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_h == 1);
      uVar38 = movmskps(uVar31 ^ uVar8,auVar50);
      iVar37 = (this->super_ConvolutionDepthWise).stride_w;
      uVar33 = (this->super_ConvolutionDepthWise).stride_h;
      if (uVar33 == 1 && (iVar37 == 1 && (uVar38 ^ 0xf) == 0)) {
        convdw3x3s1_sse(&local_1b8,top_blob,&this->weight_data_tm,
                        &(this->super_ConvolutionDepthWise).bias_data,(Option *)(ulong)uVar33);
      }
      else {
        bVar49 = (char)(uVar38 ^ 0xf) == '\0';
        if ((uVar33 != 2 || iVar37 != 2) || !bVar49) goto LAB_0040aef3;
        convdw3x3s2_sse(&local_1b8,top_blob,&this->weight_data_tm,
                        &(this->super_ConvolutionDepthWise).bias_data,
                        (Option *)
                        (ulong)CONCAT31((int3)(uVar33 >> 8),(uVar33 == 2 && iVar37 == 2) && bVar49))
        ;
      }
      goto LAB_0040b5bf;
    }
    if (iVar36 != 4) goto LAB_0040aef3;
    uVar4 = (this->super_ConvolutionDepthWise).kernel_w;
    uVar5 = (this->super_ConvolutionDepthWise).kernel_h;
    uVar6 = (this->super_ConvolutionDepthWise).dilation_w;
    uVar7 = (this->super_ConvolutionDepthWise).dilation_h;
    auVar52._0_4_ = -(uint)(uVar4 == 3);
    auVar52._4_4_ = -(uint)(uVar5 == 3);
    auVar52._8_4_ = -(uint)(uVar6 == 1);
    auVar52._12_4_ = -(uint)(uVar7 == 1);
    iVar32 = movmskps(uVar31,auVar52);
    iVar37 = (this->super_ConvolutionDepthWise).stride_w;
    iVar34 = (this->super_ConvolutionDepthWise).stride_h;
    if (iVar34 == 1 && (iVar37 == 1 && iVar32 == 0xf)) {
      convdw3x3s1_pack4_sse
                (&local_1b8,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,pOVar45);
LAB_0040b5bf:
      pLVar10 = this->activation;
      if (pLVar10 != (Layer *)0x0) {
        (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
      }
    }
    else {
      bVar29 = (byte)iVar32;
      uVar46 = (undefined7)((ulong)pOVar45 >> 8);
      if ((iVar34 == 2 && iVar37 == 2) && bVar29 == 0xf) {
        convdw3x3s2_pack4_sse
                  (&local_1b8,top_blob,&this->weight_data_tm,
                   &(this->super_ConvolutionDepthWise).bias_data,
                   (Option *)CONCAT71(uVar46,(iVar34 == 2 && iVar37 == 2) && bVar29 == 0xf));
        goto LAB_0040b5bf;
      }
      bVar29 = bVar29 >> 2 & bVar29 >> 3 & (uVar5 == 5 && uVar4 == 5);
      bVar44 = (iVar37 == 1 && iVar34 == 1) & bVar29;
      pOVar45 = (Option *)CONCAT71(uVar46,bVar44);
      if (bVar44 == 1) {
        convdw5x5s1_pack4_sse
                  (&local_1b8,top_blob,&this->weight_data_tm,
                   &(this->super_ConvolutionDepthWise).bias_data,pOVar45);
        goto LAB_0040b5bf;
      }
      if ((bVar29 & (iVar37 == 2 && iVar34 == 2)) == 1) {
        convdw5x5s2_pack4_sse
                  (&local_1b8,top_blob,&this->weight_data_tm,
                   &(this->super_ConvolutionDepthWise).bias_data,pOVar45);
        goto LAB_0040b5bf;
      }
      uVar40 = uVar5 * uVar4;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_168,(long)(int)uVar40,
                 (allocator_type *)&local_208);
      if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
        iVar37 = (this->super_ConvolutionDepthWise).dilation_h;
        iVar34 = (this->super_ConvolutionDepthWise).dilation_w;
        iVar32 = (this->super_ConvolutionDepthWise).kernel_w;
        iVar36 = 0;
        iVar39 = 0;
        iVar41 = 0;
        do {
          if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
            lVar43 = 0;
            do {
              *(int *)((long)local_168.data + (iVar36 + lVar43) * 4) = iVar41;
              iVar41 = iVar41 + (this->super_ConvolutionDepthWise).dilation_w;
              lVar43 = lVar43 + 1;
            } while ((int)lVar43 < (this->super_ConvolutionDepthWise).kernel_w);
            iVar36 = iVar36 + (int)lVar43;
          }
          iVar41 = iVar41 + (iVar28 * iVar37 - iVar34 * iVar32);
          iVar39 = iVar39 + 1;
        } while (iVar39 < (this->super_ConvolutionDepthWise).kernel_h);
      }
      auVar52 = _DAT_005f1de0;
      auVar50 = _DAT_005f1da0;
      if (0 < (int)uVar33) {
        iVar37 = 0;
        auVar51 = (undefined1  [16])0x0;
        uVar66 = 0xc2b0c0a5;
        uVar67 = 0xc2b0c0a5;
        uVar68 = 0xc2b0c0a5;
        uVar69 = 0xc2b0c0a5;
        fVar70 = (float)DAT_005f1de0;
        fVar71 = DAT_005f1de0._4_4_;
        fVar72 = DAT_005f1de0._8_4_;
        fVar73 = DAT_005f1de0._12_4_;
        local_220 = 0;
        do {
          if (-1 < iVar30) {
            pvVar48 = (void *)(top_blob->cstep * local_220 * top_blob->elemsize +
                              (long)top_blob->data);
            pvVar11 = (this->weight_data_tm).data;
            iVar34 = 0;
            do {
              if (-1 < (int)local_1c0) {
                uVar47 = 0;
                do {
                  if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                    auVar60 = ZEXT816(0);
                  }
                  else {
                    auVar60 = *(undefined1 (*) [16])
                               ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                               local_220 * 0x10);
                  }
                  if (0 < (int)uVar40) {
                    lVar43 = 0;
                    auVar56 = auVar60;
                    do {
                      auVar57 = *(undefined1 (*) [16])
                                 ((long)local_1b8.data +
                                 (long)*(int *)((long)local_168.data + lVar43) * 0x10 +
                                 (long)((this->super_ConvolutionDepthWise).stride_w * (int)uVar47 *
                                       4) * 4 +
                                 (long)(this->super_ConvolutionDepthWise).stride_h * (long)iVar34 *
                                 (long)local_1b8.w *
                                 CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) +
                                 local_1b8.cstep * local_220 *
                                 CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize));
                      pfVar1 = (float *)((long)pvVar11 + lVar43 * 4 + (long)iVar37 * 4);
                      auVar60._0_4_ = auVar56._0_4_ + *pfVar1 * auVar57._0_4_;
                      auVar60._4_4_ = auVar56._4_4_ + pfVar1[1] * auVar57._4_4_;
                      auVar60._8_4_ = auVar56._8_4_ + pfVar1[2] * auVar57._8_4_;
                      auVar60._12_4_ = auVar56._12_4_ + pfVar1[3] * auVar57._12_4_;
                      lVar43 = lVar43 + 4;
                      auVar56 = auVar60;
                    } while ((ulong)uVar40 << 2 != lVar43);
                  }
                  fVar53 = auVar60._4_4_;
                  fVar62 = auVar60._8_4_;
                  fVar58 = auVar60._12_4_;
                  switch((this->super_ConvolutionDepthWise).activation_type) {
                  case 1:
                    auVar60 = maxps(auVar60,auVar51);
                    break;
                  case 2:
                    auVar56 = maxps(auVar60,auVar51);
                    auVar57 = minps(auVar60,auVar51);
                    fVar53 = *(this->super_ConvolutionDepthWise).activation_params.data;
                    auVar60._4_4_ = fVar53 * auVar57._4_4_ + auVar56._4_4_;
                    auVar60._0_4_ = fVar53 * auVar57._0_4_ + auVar56._0_4_;
                    auVar60._8_4_ = fVar53 * auVar57._8_4_ + auVar56._8_4_;
                    auVar60._12_4_ = fVar53 * auVar57._12_4_ + auVar56._12_4_;
                    break;
                  case 3:
                    puVar12 = (undefined4 *)
                              (this->super_ConvolutionDepthWise).activation_params.data;
                    uVar2 = *puVar12;
                    uVar3 = puVar12[1];
                    auVar55._4_4_ = uVar2;
                    auVar55._0_4_ = uVar2;
                    auVar55._8_4_ = uVar2;
                    auVar55._12_4_ = uVar2;
                    auVar60 = maxps(auVar60,auVar55);
                    auVar16._4_4_ = uVar3;
                    auVar16._0_4_ = uVar3;
                    auVar16._8_4_ = uVar3;
                    auVar16._12_4_ = uVar3;
                    auVar60 = minps(auVar60,auVar16);
                    break;
                  case 4:
                    auVar59._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
                    auVar59._8_4_ = -fVar62;
                    auVar59._12_4_ = -fVar58;
                    auVar60 = minps(auVar59,auVar50);
                    auVar18._4_4_ = uVar67;
                    auVar18._0_4_ = uVar66;
                    auVar18._8_4_ = uVar68;
                    auVar18._12_4_ = uVar69;
                    auVar60 = maxps(auVar60,auVar18);
                    fVar62 = auVar60._0_4_ * 1.442695 + 0.5;
                    fVar74 = auVar60._4_4_ * 1.442695 + 0.5;
                    fVar76 = auVar60._8_4_ * 1.442695 + 0.5;
                    fVar61 = auVar60._12_4_ * 1.442695 + 0.5;
                    fVar53 = (float)(int)fVar62;
                    fVar58 = (float)(int)fVar74;
                    fVar75 = (float)(int)fVar76;
                    fVar77 = (float)(int)fVar61;
                    fVar53 = fVar53 - (float)(-(uint)(fVar62 < fVar53) & (uint)fVar70);
                    fVar58 = fVar58 - (float)(-(uint)(fVar74 < fVar58) & (uint)fVar71);
                    fVar75 = fVar75 - (float)(-(uint)(fVar76 < fVar75) & (uint)fVar72);
                    fVar77 = fVar77 - (float)(-(uint)(fVar61 < fVar77) & (uint)fVar73);
                    fVar62 = fVar53 * -0.6931472 + auVar60._0_4_;
                    fVar74 = fVar58 * -0.6931472 + auVar60._4_4_;
                    fVar76 = fVar75 * -0.6931472 + auVar60._8_4_;
                    fVar61 = fVar77 * -0.6931472 + auVar60._12_4_;
                    auVar15._4_4_ =
                         (float)((int)fVar58 * 0x800000 + (int)fVar71) *
                         (fVar74 + fVar71 +
                         (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) *
                            fVar74 + 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) *
                         fVar74 * fVar74) + fVar71;
                    auVar15._0_4_ =
                         (float)((int)fVar53 * 0x800000 + (int)fVar70) *
                         (fVar62 + fVar70 +
                         (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) *
                            fVar62 + 0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) *
                         fVar62 * fVar62) + fVar70;
                    auVar15._8_4_ =
                         (float)((int)fVar75 * 0x800000 + (int)fVar72) *
                         (fVar76 + fVar72 +
                         (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) *
                            fVar76 + 0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) *
                         fVar76 * fVar76) + fVar72;
                    auVar15._12_4_ =
                         (float)((int)fVar77 * 0x800000 + (int)fVar73) *
                         (fVar61 + fVar73 +
                         (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) *
                            fVar61 + 0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) *
                         fVar61 * fVar61) + fVar73;
                    auVar60 = divps(auVar52,auVar15);
                    break;
                  case 5:
                    auVar51 = minps(auVar60,auVar50);
                    auVar17._4_4_ = uVar67;
                    auVar17._0_4_ = uVar66;
                    auVar17._8_4_ = uVar68;
                    auVar17._12_4_ = uVar69;
                    auVar51 = maxps(auVar51,auVar17);
                    fVar74 = auVar51._0_4_ * 1.442695 + 0.5;
                    fVar75 = auVar51._4_4_ * 1.442695 + 0.5;
                    fVar76 = auVar51._8_4_ * 1.442695 + 0.5;
                    fVar77 = auVar51._12_4_ * 1.442695 + 0.5;
                    fVar61 = (float)(int)fVar74;
                    fVar63 = (float)(int)fVar75;
                    fVar64 = (float)(int)fVar76;
                    fVar65 = (float)(int)fVar77;
                    fVar61 = fVar61 - (float)(-(uint)(fVar74 < fVar61) & (uint)fVar70);
                    fVar63 = fVar63 - (float)(-(uint)(fVar75 < fVar63) & (uint)fVar71);
                    fVar64 = fVar64 - (float)(-(uint)(fVar76 < fVar64) & (uint)fVar72);
                    fVar65 = fVar65 - (float)(-(uint)(fVar77 < fVar65) & (uint)fVar73);
                    fVar74 = auVar51._0_4_ - fVar61 * 0.6931472;
                    fVar75 = auVar51._4_4_ - fVar63 * 0.6931472;
                    fVar76 = auVar51._8_4_ - fVar64 * 0.6931472;
                    fVar77 = auVar51._12_4_ - fVar65 * 0.6931472;
                    auVar78._0_4_ =
                         (float)((int)fVar61 * 0x800000 + (int)fVar70) *
                         (fVar74 + fVar70 +
                         (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) *
                            fVar74 + 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) *
                         fVar74 * fVar74) + fVar70;
                    auVar78._4_4_ =
                         (float)((int)fVar63 * 0x800000 + (int)fVar71) *
                         (fVar75 + fVar71 +
                         (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) *
                            fVar75 + 0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) *
                         fVar75 * fVar75) + fVar71;
                    auVar78._8_4_ =
                         (float)((int)fVar64 * 0x800000 + (int)fVar72) *
                         (fVar76 + fVar72 +
                         (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) *
                            fVar76 + 0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) *
                         fVar76 * fVar76) + fVar72;
                    auVar78._12_4_ =
                         (float)((int)fVar65 * 0x800000 + (int)fVar73) *
                         (fVar77 + fVar73 +
                         (((((fVar77 * 0.00019875691 + 0.0013981999) * fVar77 + 0.008333452) *
                            fVar77 + 0.041665796) * fVar77 + 0.16666666) * fVar77 + 0.5) *
                         fVar77 * fVar77) + fVar73;
                    auVar56 = maxps(auVar78,_DAT_005f1e50);
                    fVar74 = (float)(auVar56._0_4_ & 0x807fffff | 0x3f000000);
                    fVar76 = (float)(auVar56._4_4_ & 0x807fffff | 0x3f000000);
                    fVar61 = (float)(auVar56._8_4_ & 0x807fffff | 0x3f000000);
                    fVar64 = (float)(auVar56._12_4_ & 0x807fffff | 0x3f000000);
                    fVar75 = fVar74 + -1.0 + (float)(-(uint)(fVar74 < 0.70710677) & (uint)fVar74);
                    fVar77 = fVar76 + -1.0 + (float)(-(uint)(fVar76 < 0.70710677) & (uint)fVar76);
                    fVar63 = fVar61 + -1.0 + (float)(-(uint)(fVar61 < 0.70710677) & (uint)fVar61);
                    fVar65 = fVar64 + -1.0 + (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar64);
                    uVar66 = (undefined4)DAT_005f1db0;
                    uVar67 = DAT_005f1db0._4_4_;
                    uVar68 = DAT_005f1db0._8_4_;
                    uVar69 = DAT_005f1db0._12_4_;
                    auVar54._0_8_ =
                         CONCAT44(-(uint)(auVar78._4_4_ <= 0.0),-(uint)(auVar78._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar54._8_4_ = -(uint)(auVar78._8_4_ <= 0.0) & 0x7fffffff;
                    auVar54._12_4_ = -(uint)(auVar78._12_4_ <= 0.0) & 0x7fffffff;
                    auVar51._4_4_ =
                         ~-(uint)(auVar78._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar56._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar76 < 0.70710677) & (uint)fVar71)) * 0.6931472 +
                                 fVar77 + (((((((((fVar77 * 0.070376836 + -0.1151461) * fVar77 +
                                                 0.116769984) * fVar77 + -0.12420141) * fVar77 +
                                               0.14249323) * fVar77 + -0.16668057) * fVar77 +
                                             0.20000714) * fVar77 + -0.24999994) * fVar77 +
                                           0.3333333) * fVar77 + -0.5) * fVar77 * fVar77) * -2.0);
                    auVar51._0_4_ =
                         ~-(uint)(auVar78._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar56._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar74 < 0.70710677) & (uint)fVar70)) * 0.6931472 +
                                 fVar75 + (((((((((fVar75 * 0.070376836 + -0.1151461) * fVar75 +
                                                 0.116769984) * fVar75 + -0.12420141) * fVar75 +
                                               0.14249323) * fVar75 + -0.16668057) * fVar75 +
                                             0.20000714) * fVar75 + -0.24999994) * fVar75 +
                                           0.3333333) * fVar75 + -0.5) * fVar75 * fVar75) * -2.0);
                    auVar51._8_4_ =
                         ~-(uint)(auVar78._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar56._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar61 < 0.70710677) & (uint)fVar72)) * 0.6931472 +
                                 fVar63 + (((((((((fVar63 * 0.070376836 + -0.1151461) * fVar63 +
                                                 0.116769984) * fVar63 + -0.12420141) * fVar63 +
                                               0.14249323) * fVar63 + -0.16668057) * fVar63 +
                                             0.20000714) * fVar63 + -0.24999994) * fVar63 +
                                           0.3333333) * fVar63 + -0.5) * fVar63 * fVar63) * -2.0);
                    auVar51._12_4_ =
                         ~-(uint)(auVar78._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar56._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar73)) * 0.6931472 +
                                 fVar65 + (((((((((fVar65 * 0.070376836 + -0.1151461) * fVar65 +
                                                 0.116769984) * fVar65 + -0.12420141) * fVar65 +
                                               0.14249323) * fVar65 + -0.16668057) * fVar65 +
                                             0.20000714) * fVar65 + -0.24999994) * fVar65 +
                                           0.3333333) * fVar65 + -0.5) * fVar65 * fVar65) * -2.0);
                    auVar51 = minps(auVar54 | auVar51,auVar50);
                    auVar51 = maxps(auVar51,_DAT_005f1db0);
                    fVar74 = auVar51._0_4_ * 1.442695 + 0.5;
                    fVar75 = auVar51._4_4_ * 1.442695 + 0.5;
                    fVar76 = auVar51._8_4_ * 1.442695 + 0.5;
                    fVar77 = auVar51._12_4_ * 1.442695 + 0.5;
                    fVar61 = (float)(int)fVar74;
                    fVar63 = (float)(int)fVar75;
                    fVar64 = (float)(int)fVar76;
                    fVar65 = (float)(int)fVar77;
                    fVar61 = fVar61 - (float)(-(uint)(fVar74 < fVar61) & (uint)fVar70);
                    fVar63 = fVar63 - (float)(-(uint)(fVar75 < fVar63) & (uint)fVar71);
                    fVar64 = fVar64 - (float)(-(uint)(fVar76 < fVar64) & (uint)fVar72);
                    fVar65 = fVar65 - (float)(-(uint)(fVar77 < fVar65) & (uint)fVar73);
                    fVar74 = auVar51._0_4_ - fVar61 * 0.6931472;
                    fVar75 = auVar51._4_4_ - fVar63 * 0.6931472;
                    fVar76 = auVar51._8_4_ - fVar64 * 0.6931472;
                    fVar77 = auVar51._12_4_ - fVar65 * 0.6931472;
                    auVar51 = ZEXT816(0);
                    auVar14._4_4_ =
                         (float)((int)fVar63 * 0x800000 + (int)fVar71) *
                         (fVar75 + fVar71 +
                         (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) *
                            fVar75 + 0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) *
                         fVar75 * fVar75) + fVar71;
                    auVar14._0_4_ =
                         (float)((int)fVar61 * 0x800000 + (int)fVar70) *
                         (fVar74 + fVar70 +
                         (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) *
                            fVar74 + 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) *
                         fVar74 * fVar74) + fVar70;
                    auVar14._8_4_ =
                         (float)((int)fVar64 * 0x800000 + (int)fVar72) *
                         (fVar76 + fVar72 +
                         (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) *
                            fVar76 + 0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) *
                         fVar76 * fVar76) + fVar72;
                    auVar14._12_4_ =
                         (float)((int)fVar65 * 0x800000 + (int)fVar73) *
                         (fVar77 + fVar73 +
                         (((((fVar77 * 0.00019875691 + 0.0013981999) * fVar77 + 0.008333452) *
                            fVar77 + 0.041665796) * fVar77 + 0.16666666) * fVar77 + 0.5) *
                         fVar77 * fVar77) + fVar73;
                    auVar56 = divps(_DAT_005f2a60,auVar14);
                    auVar57._0_4_ = auVar56._0_4_ + -1.0;
                    auVar57._4_4_ = auVar56._4_4_ + -1.0;
                    auVar57._8_4_ = auVar56._8_4_ + -1.0;
                    auVar57._12_4_ = auVar56._12_4_ + -1.0;
                    goto LAB_0040bb5e;
                  case 6:
                    pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
                    fVar74 = *pfVar1;
                    fVar75 = pfVar1[1];
                    auVar56._0_4_ = fVar74 * auVar60._0_4_ + fVar75;
                    auVar56._4_4_ = fVar74 * fVar53 + fVar75;
                    auVar56._8_4_ = fVar74 * fVar62 + fVar75;
                    auVar56._12_4_ = fVar74 * fVar58 + fVar75;
                    auVar56 = maxps(auVar56,auVar51);
                    auVar57 = minps(auVar56,auVar52);
LAB_0040bb5e:
                    auVar60._0_4_ = auVar60._0_4_ * auVar57._0_4_;
                    auVar60._4_4_ = fVar53 * auVar57._4_4_;
                    auVar60._8_4_ = fVar62 * auVar57._8_4_;
                    auVar60._12_4_ = fVar58 * auVar57._12_4_;
                  }
                  *(undefined1 (*) [16])((long)pvVar48 + uVar47 * 0x10) = auVar60;
                  uVar47 = uVar47 + 1;
                } while (uVar47 != _w);
              }
              pvVar48 = (void *)((long)pvVar48 + (long)(int)(_w * 4) * 4);
              bVar49 = iVar34 != iVar30;
              iVar34 = iVar34 + 1;
            } while (bVar49);
          }
          local_220 = local_220 + 1;
          iVar37 = iVar37 + uVar40 * 4;
        } while (local_220 != uVar33);
      }
      if (local_168.data != (void *)0x0) {
        operator_delete(local_168.data,
                        CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize) -
                        (long)local_168.data);
      }
    }
    iVar39 = 0;
    goto LAB_0040bd2d;
  }
LAB_0040aef3:
  uVar31 = (int)uVar31 / (int)uVar8;
  uVar40 = (int)uVar40 / (int)uVar8;
  local_248 = 1;
  uVar33 = 1;
  if (opt->use_packing_layout == true) {
    local_248 = (uint)((uVar31 & 3) == 0) * 3 + 1;
    uVar33 = (uint)((uVar40 & 3) == 0) * 3 + 1;
  }
  piVar9 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  local_168.data = local_1b8.data;
  local_168.refcount._0_4_ = local_1b8.refcount._0_4_;
  local_168.refcount._4_4_ = local_1b8.refcount._4_4_;
  local_168.elemsize._0_4_ = (undefined4)local_1b8.elemsize;
  local_168.elemsize._4_4_ = local_1b8.elemsize._4_4_;
  local_168.elempack = local_1b8.elempack;
  local_168.allocator = local_1b8.allocator;
  local_168.w = local_1b8.w;
  local_168.dims = local_1b8.dims;
  local_168.d = local_1b8.d;
  local_168.h = local_1b8.h;
  local_168.c = local_1b8.c;
  local_168.cstep = local_1b8.cstep;
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + 1;
    UNLOCK();
  }
  if (local_248 < iVar36) {
    local_208.data = *(void **)opt;
    uVar20 = opt->openmp_blocktime;
    uVar21 = opt->use_winograd_convolution;
    uVar23 = opt->use_sgemm_convolution;
    uVar25 = opt->use_int8_inference;
    uVar27 = opt->use_vulkan_compute;
    uVar26 = CONCAT11(uVar27,uVar25);
    uVar24 = CONCAT21(uVar26,uVar23);
    uVar22 = CONCAT31(uVar24,uVar21);
    local_208.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_208._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
    local_208._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_208.c._0_1_ = opt->use_winograd43_convolution;
    local_208.c._1_1_ = opt->use_winograd63_convolution;
    local_208.c._2_1_ = opt->use_a53_a55_optimized_kernel;
    local_208.c._3_1_ = opt->use_fp16_uniform;
    local_208._60_1_ = opt->use_int8_uniform;
    local_208._61_1_ = opt->use_reserved_9;
    local_208._62_1_ = opt->use_reserved_10;
    local_208._63_1_ = opt->use_reserved_11;
    local_208.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_208.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_208.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_208.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_208.elempack = uVar20;
    local_208._28_4_ = uVar22;
    convert_packing(&local_1b8,&local_168,local_248,(Option *)&local_208);
    if ((local_168.data != (void *)0x0) && ((long)local_168.c * local_168.cstep != 0))
    goto LAB_0040b03c;
    iVar39 = -100;
  }
  else {
LAB_0040b03c:
    local_208.data = top_blob->data;
    piVar9 = top_blob->refcount;
    local_208.refcount._0_4_ = SUB84(piVar9,0);
    local_208.refcount._4_4_ = (undefined4)((ulong)piVar9 >> 0x20);
    local_208.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_208.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_208.elempack = top_blob->elempack;
    local_208.allocator = top_blob->allocator;
    local_208.dims = top_blob->dims;
    local_208.w = top_blob->w;
    local_208.h = top_blob->h;
    local_208.d = top_blob->d;
    local_208.c = top_blob->c;
    local_208.cstep = top_blob->cstep;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    if (uVar33 < _elempack) {
      Mat::create(&local_208,_w,iVar30 + 1,
                  (this->super_ConvolutionDepthWise).num_output / (int)uVar33,
                  (ulong)uVar33 * ((ulong)_elemsize >> sVar19),uVar33,opt->workspace_allocator);
      iVar39 = -100;
      if ((local_208.data != (void *)0x0) && ((long)local_208.c * local_208.cstep != 0))
      goto LAB_0040b100;
    }
    else {
LAB_0040b100:
      iVar30 = (this->super_ConvolutionDepthWise).group;
      bVar49 = 0 < iVar30;
      local_1c0 = opt;
      if (iVar30 < 1) {
        iVar39 = -100;
      }
      else {
        iVar39 = -100;
        iVar37 = 0;
        iVar30 = 0;
        lVar43 = 0;
        do {
          local_88 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
          local_c8 = (pointer)((long)(iVar37 / local_248) * local_168.cstep * local_88 +
                              (long)local_168.data);
          lVar42 = (long)local_168.h;
          uStack_c0 = 0;
          uStack_bc = 0;
          local_b8 = (undefined4)local_168.elemsize;
          uStack_b4 = local_168.elemsize._4_4_;
          local_b0 = local_168.elempack;
          local_a8 = local_168.allocator;
          lVar35 = (long)local_168.d;
          uStack_98._0_4_ = local_168.h;
          uStack_98._4_4_ = local_168.d;
          local_88 = (lVar35 * local_88 * lVar42 * local_168.w + 0xf & 0xfffffffffffffff0) /
                     local_88;
          local_a0._0_4_ = local_168.dims;
          local_a0._4_4_ = local_168.w;
          lVar42 = (long)local_208.h;
          local_d8 = CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize);
          local_118 = (void *)((long)(iVar30 / (int)uVar33) * local_208.cstep * local_d8 +
                              (long)local_208.data);
          uStack_110 = 0;
          uStack_10c = 0;
          local_108 = (undefined4)local_208.elemsize;
          uStack_104 = local_208.elemsize._4_4_;
          local_100 = local_208.elempack;
          local_f8 = local_208.allocator;
          lVar35 = (long)local_208.d;
          uStack_e8._0_4_ = local_208.h;
          uStack_e8._4_4_ = local_208.d;
          local_d8 = (lVar35 * local_d8 * lVar42 * local_208.w + 0xf & 0xfffffffffffffff0) /
                     local_d8;
          local_f0._0_4_ = local_208.dims;
          local_f0._4_4_ = local_208.w;
          pLVar10 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar43];
          local_78._0_1_ = local_1c0->lightmode;
          local_78._1_1_ = local_1c0->use_shader_pack8;
          local_78._2_1_ = local_1c0->use_subgroup_ops;
          local_78._3_1_ = local_1c0->use_reserved_0;
          local_78._4_4_ = local_1c0->num_threads;
          local_68 = local_1c0->workspace_allocator;
          uStack_60._0_4_ = local_1c0->openmp_blocktime;
          uStack_60._4_1_ = local_1c0->use_winograd_convolution;
          uStack_60._5_1_ = local_1c0->use_sgemm_convolution;
          uStack_60._6_1_ = local_1c0->use_int8_inference;
          uStack_60._7_1_ = local_1c0->use_vulkan_compute;
          local_58._0_1_ = local_1c0->use_bf16_storage;
          local_58._1_1_ = local_1c0->use_fp16_packed;
          local_58._2_1_ = local_1c0->use_fp16_storage;
          local_58._3_1_ = local_1c0->use_fp16_arithmetic;
          local_58._4_1_ = local_1c0->use_int8_packed;
          local_58._5_1_ = local_1c0->use_int8_storage;
          local_58._6_1_ = local_1c0->use_int8_arithmetic;
          local_58._7_1_ = local_1c0->use_packing_layout;
          uStack_50._0_4_ = local_1c0->vulkan_device_index;
          uStack_50._4_1_ = local_1c0->use_reserved_1;
          uStack_50._5_1_ = local_1c0->use_image_storage;
          uStack_50._6_1_ = local_1c0->use_tensor_storage;
          uStack_50._7_1_ = local_1c0->use_reserved_2;
          local_48 = local_1c0->flush_denormals;
          uStack_44._0_1_ = local_1c0->use_local_pool_allocator;
          uStack_44._1_1_ = local_1c0->use_shader_local_memory;
          uStack_44._2_1_ = local_1c0->use_cooperative_matrix;
          uStack_44._3_1_ = local_1c0->use_winograd23_convolution;
          uStack_40._0_1_ = local_1c0->use_winograd43_convolution;
          uStack_40._1_1_ = local_1c0->use_winograd63_convolution;
          uStack_40._2_1_ = local_1c0->use_a53_a55_optimized_kernel;
          uStack_40._3_1_ = local_1c0->use_fp16_uniform;
          uStack_3c._0_1_ = local_1c0->use_int8_uniform;
          uStack_3c._1_1_ = local_1c0->use_reserved_9;
          uStack_3c._2_1_ = local_1c0->use_reserved_10;
          uStack_3c._3_1_ = local_1c0->use_reserved_11;
          pAStack_70 = local_208.allocator;
          local_e0 = (int)uVar40 / (int)uVar33;
          local_90 = (int)uVar31 / local_248;
          iVar34 = (*pLVar10->_vptr_Layer[7])(pLVar10,&local_c8,&local_118,&local_78);
          if (iVar34 != 0) {
            iVar39 = iVar34;
          }
          piVar9 = (int *)CONCAT44(uStack_10c,uStack_110);
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              if (local_f8 == (Allocator *)0x0) {
                if (local_118 != (void *)0x0) {
                  free(local_118);
                }
              }
              else {
                (*local_f8->_vptr_Allocator[3])();
              }
            }
          }
          local_d8 = 0;
          local_118 = (void *)0x0;
          uStack_110 = 0;
          uStack_10c = 0;
          local_108 = 0;
          uStack_104 = 0;
          local_100 = 0;
          local_f0 = 0;
          uStack_e8 = 0;
          local_e0 = 0;
          piVar9 = (int *)CONCAT44(uStack_bc,uStack_c0);
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              if (local_a8 == (Allocator *)0x0) {
                if (local_c8 != (pointer)0x0) {
                  free(local_c8);
                }
              }
              else {
                (*local_a8->_vptr_Allocator[3])();
              }
            }
          }
          local_88 = 0;
          local_c8 = (pointer)0x0;
          uStack_c0 = 0;
          uStack_bc = 0;
          local_b8 = 0;
          uStack_b4 = 0;
          local_b0 = 0;
          local_a0 = 0;
          uStack_98 = 0;
          local_90 = 0;
          if (iVar34 != 0) break;
          lVar43 = lVar43 + 1;
          lVar35 = (long)(this->super_ConvolutionDepthWise).group;
          iVar30 = iVar30 + uVar40;
          iVar37 = iVar37 + uVar31;
          bVar49 = lVar43 < lVar35;
        } while (lVar43 < lVar35);
      }
      if (!bVar49) {
        if (uVar33 < _elempack) {
          convert_packing(&local_208,top_blob,_elempack,local_1c0);
          iVar39 = -100;
          if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
          goto LAB_0040bc56;
        }
        else if (&local_208 != top_blob) {
          piVar9 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + 1;
            UNLOCK();
          }
          piVar9 = top_blob->refcount;
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_208.data;
          top_blob->refcount = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
          top_blob->elemsize = CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize);
          top_blob->elempack = local_208.elempack;
          top_blob->allocator = local_208.allocator;
          top_blob->dims = local_208.dims;
          top_blob->w = local_208.w;
          top_blob->h = local_208.h;
          top_blob->d = local_208.d;
          top_blob->c = local_208.c;
          top_blob->cstep = local_208.cstep;
        }
        iVar39 = 0;
      }
    }
LAB_0040bc56:
    piVar9 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_208.allocator == (Allocator *)0x0) {
          if (local_208.data != (void *)0x0) {
            free(local_208.data);
          }
        }
        else {
          (*(local_208.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_208.cstep = 0;
    local_208.data = (void *)0x0;
    local_208.refcount._0_4_ = 0;
    local_208.refcount._4_4_ = 0;
    local_208.elemsize._0_4_ = 0;
    local_208.elemsize._4_4_ = 0;
    local_208.elempack = 0;
    local_208.dims = 0;
    local_208.w = 0;
    local_208.h = 0;
    local_208.d = 0;
    local_208._56_8_ = local_208._56_8_ & 0xffffffff00000000;
  }
  piVar9 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_168.cstep = 0;
  local_168.data = (void *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize._0_4_ = 0;
  local_168.elemsize._4_4_ = 0;
  local_168.elempack = 0;
  local_168.dims = 0;
  local_168.w = 0;
  local_168.h = 0;
  local_168.d = 0;
  local_168.c = 0;
LAB_0040bd2d:
  piVar9 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}